

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

uint32_t helper_bcdctz_ppc64(ppc_avr_t *r,ppc_avr_t *b,uint32_t ps)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  uint64_t local_38;
  uint64_t uStack_30;
  
  bVar4 = (b->u8[0] & 0xf) - 10;
  bVar3 = 5 < bVar4;
  if (bVar3) {
    bVar8 = 0x70;
    bVar7 = 0xd0;
  }
  else {
    bVar7 = (byte)(0xc0c0d0c0d0c0 >> (bVar4 * '\b' & 0x3f));
    bVar8 = (byte)(0x303070307030 >> (bVar4 * '\b' & 0x3f));
  }
  local_38 = 0;
  uStack_30 = 0;
  uVar2 = b->u64[1];
  uVar9 = 0;
  do {
    uVar1 = uVar9 + 1;
    bVar6 = b->u8[uVar1 >> 1 & 0x7fffffff] & 0xf;
    if ((uVar9 & 1) == 0) {
      bVar6 = b->u8[uVar1 >> 1 & 0x7fffffff] >> 4;
    }
    if (9 < bVar6) {
      bVar3 = true;
    }
  } while ((!bVar3) &&
          (*(byte *)((long)&local_38 + uVar9) = bVar6 | (ps == 0) * '@' - 0x10U, uVar9 = uVar1,
          uVar1 != 0x10));
  if (ps == 0) {
    bVar7 = bVar8;
  }
  local_38 = CONCAT71(local_38._1_7_,bVar7 | (byte)local_38 & 0xf);
  if ((uVar2 == 0) && (b->u64[0] < 0x10)) {
    uVar5 = 2;
  }
  else if (bVar4 < 6) {
    uVar5 = *(uint *)(&DAT_00dbe430 + (ulong)bVar4 * 4);
  }
  else {
    uVar5 = 8;
  }
  if (bVar3) {
    uVar5 = 1;
  }
  else {
    uVar5 = uVar5 | 0xf < uVar2;
  }
  r->u64[0] = local_38;
  r->u64[1] = uStack_30;
  return uVar5;
}

Assistant:

static int bcd_get_sgn(ppc_avr_t *bcd)
{
    switch (bcd->VsrB(BCD_DIG_BYTE(0)) & 0xF) {
    case BCD_PLUS_PREF_1:
    case BCD_PLUS_PREF_2:
    case BCD_PLUS_ALT_1:
    case BCD_PLUS_ALT_2:
    {
        return 1;
    }

    case BCD_NEG_PREF:
    case BCD_NEG_ALT:
    {
        return -1;
    }

    default:
    {
        return 0;
    }
    }
}